

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_boundary.cpp
# Opt level: O0

void segment_operator(void)

{
  string *in_stack_fffffffffffffe68;
  string *in_stack_fffffffffffffe70;
  string *sl;
  undefined1 local_149 [40];
  allocator local_121;
  string local_120 [39];
  allocator local_f9;
  string local_f8 [39];
  allocator local_d1;
  string local_d0 [39];
  allocator local_a9;
  string local_a8 [39];
  allocator local_81;
  string local_80 [39];
  allocator local_59;
  string local_58 [55];
  allocator local_21;
  string local_20 [32];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_20,"",&local_21);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"a",&local_59);
  test_op(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,0);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  std::__cxx11::string::~string(local_20);
  std::allocator<char>::~allocator((allocator<char> *)&local_21);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"",&local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,"",&local_a9);
  test_op(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,0);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,"aa",&local_d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,"aaa",&local_f9);
  test_op(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,0);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_120,"aa",&local_121);
  sl = (string *)local_149;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_149 + 1),"ab",(allocator *)sl);
  test_op(sl,in_stack_fffffffffffffe68,0);
  std::__cxx11::string::~string((string *)(local_149 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_149);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  return;
}

Assistant:

void segment_operator()
{
    test_op("","a",-1);
    test_op("","",0);
    test_op("aa","aaa",-1);
    test_op("aa","ab",-1);
}